

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
anurbs::
PythonDataType<anurbs::Model,_anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
::add_with_attributes(Model *self,Pointer<anurbs::Surface<3L>_> *data,string *attributes)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_> RVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::
  __shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&stack0xffffffffffffffd0,
                 (__shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)attributes);
  Model::add<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>
            (self,data,(string *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  RVar1.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)self;
  return (Ref<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Ref<TData> add_with_attributes(TModel& self, Pointer<TData> data,
        const std::string& attributes)
    {
        return self.template add<TData>(data, attributes);
    }